

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSIMDShuffleSetRight(BinaryenExpressionRef expr,BinaryenExpressionRef rightExpr)

{
  if (expr->_id != SIMDShuffleId) {
    __assert_fail("expression->is<SIMDShuffle>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xcc3,
                  "void BinaryenSIMDShuffleSetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (rightExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)rightExpr;
    return;
  }
  __assert_fail("rightExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xcc4,
                "void BinaryenSIMDShuffleSetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDShuffleSetRight(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef rightExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShuffle>());
  assert(rightExpr);
  static_cast<SIMDShuffle*>(expression)->right = (Expression*)rightExpr;
}